

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::ParseFromCodedStream(MessageLite *this,CodedInputStream *input)

{
  int iVar1;
  LogMessage *other;
  MessageLite *message;
  LogFinisher local_69;
  string local_68;
  LogMessage local_48;
  
  (*this->_vptr_MessageLite[7])();
  iVar1 = (*this->_vptr_MessageLite[0xb])(this,input);
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_MessageLite[8])(this);
    if ((char)iVar1 != '\0') {
      return true;
    }
    message = (MessageLite *)0x79;
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x79);
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)"parse",(char *)this,message);
    other = internal::LogMessage::operator<<(&local_48,&local_68);
    internal::LogFinisher::operator=(&local_69,other);
    std::__cxx11::string::~string((string *)&local_68);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return false;
}

Assistant:

bool MessageLite::ParseFromCodedStream(io::CodedInputStream* input) {
  return InlineParseFromCodedStream(input, this);
}